

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall cmCTestP4::DescribeParser::NextSection(DescribeParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  SectionType SVar1;
  Revision local_120;
  
  SVar1 = this->Section;
  if (SVar1 == SectionDiff) {
    (*(this->P4->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[8])
              (this->P4,&this->Rev,&this->Changes);
    __s = &local_120.Rev.field_2;
    memset(__s,0,0xf0);
    local_120.Rev._M_string_length = 0;
    local_120.Date._M_dataplus._M_p = (pointer)&local_120.Date.field_2;
    local_120.Date.field_2._M_local_buf[0] = '\0';
    local_120.Author._M_dataplus._M_p = (pointer)&local_120.Author.field_2;
    local_120.Author.field_2._M_local_buf[0] = '\0';
    local_120.EMail._M_dataplus._M_p = (pointer)&local_120.EMail.field_2;
    local_120.EMail.field_2._M_local_buf[0] = '\0';
    local_120.Committer._M_dataplus._M_p = (pointer)&local_120.Committer.field_2;
    local_120.Committer.field_2._M_local_buf[0] = '\0';
    local_120.CommitterEMail._M_dataplus._M_p = (pointer)&local_120.CommitterEMail.field_2;
    local_120.CommitterEMail.field_2._M_local_buf[0] = '\0';
    local_120.CommitDate._M_dataplus._M_p = (pointer)&local_120.CommitDate.field_2;
    local_120.CommitDate.field_2._M_local_buf[0] = '\0';
    local_120.Log._M_dataplus._M_p = (pointer)&local_120.Log.field_2;
    local_120.Log.field_2._M_local_buf[0] = '\0';
    local_120.Rev._M_dataplus._M_p = (pointer)__s;
    cmCTestVC::Revision::operator=(&this->Rev,&local_120);
    cmCTestVC::Revision::~Revision(&local_120);
    SVar1 = this->Section;
  }
  this->Section = (int)(SVar1 + SectionBody) % 4;
  return;
}

Assistant:

void NextSection()
  {
    if (this->Section == SectionDiff) {
      this->P4->DoRevision(this->Rev, this->Changes);
      this->Rev = Revision();
    }

    this->Section = SectionType((this->Section + 1) % SectionCount);
  }